

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

ssize_t __thiscall CharConvUCS2::read(CharConvUCS2 *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined4 in_register_00000034;
  long lVar4;
  int i;
  
  lVar4 = CONCAT44(in_register_00000034,__fd);
  uVar2 = (uint)__nbytes;
  iVar1 = (**(code **)(*__buf + 0x10))(__buf,lVar4,(long)(int)(uVar2 << 1));
  if (iVar1 == 0) {
    while( true ) {
      uVar2 = uVar2 - 1;
      if ((int)uVar2 < 1) break;
      uVar3 = (**(code **)(*(long *)this + 0x48))(this,lVar4 + (int)(uVar2 * 2));
      *(undefined4 *)(lVar4 + (long)(int)uVar2 * 4) = uVar3;
    }
    return (ulong)uVar2;
  }
  err_throw(0);
}

Assistant:

virtual void read(wchar_t *buf, CVmDataSource *src, int cnt)
    {
        /* 
         *   Read the wide characters (two bytes each).  The local wchar_t
         *   type could be bigger than two bytes, but can't be less, so we
         *   can be sure we have enough space for the file read.  
         */
        if (src->read(buf, cnt*2))
            err_throw(VMERR_READ_FILE);

        /* 
         *   Convert each character from little-endian to local byte order.
         *   The local wchar_t type could be bigger than two bytes, so work
         *   from the end of the buffer downwards - this will ensure we won't
         *   overwrite bytes before we translate them. 
         */
        for (int i = cnt - 1 ; i > 0 ; --i)
            buf[i] = file_to_machine((unsigned char *)buf + i*2);
    }